

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O2

void __thiscall Synthesizer::Voice::Process(Voice *this,float *l,float *r)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  pfVar1 = this->p;
  fVar3 = pfVar1[1];
  fVar4 = pfVar1[2];
  fVar5 = pfVar1[3];
  fVar6 = this->aenv * this->amp;
  if (this->rampcount < 0x40) {
    iVar2 = this->rampcount + 1;
    this->rampcount = iVar2;
    fVar6 = fVar6 * (float)iVar2 * 0.015625;
  }
  fVar3 = fVar4 * this->fenv + fVar3;
  fVar3 = ((ABS(fVar3 + -0.0001) - ABS(fVar3 + -0.99)) + 0.9901) * 0.5;
  fVar5 = (1.0 - fVar5) * (1.0 - fVar5);
  fVar3 = fVar3 * fVar3 * 0.707;
  fVar4 = VoiceChannel::Process(this->channels,fVar3,fVar5);
  *l = fVar4 * fVar6 + *l;
  fVar3 = VoiceChannel::Process(this->channels + 1,fVar3,fVar5);
  *r = fVar3 * fVar6 + *r;
  this->aenv = this->aenv * this->aenvdecay + 1e-11;
  this->fenv = this->fenv * this->fenvdecay + 1e-11;
  return;
}

Assistant:

inline void Process(float& l, float& r)
        {
            float cut = FastClip(p[P_CUTOFF] + p[P_CUTENV] * fenv, 0.0001f, 0.99f); cut = cut * cut * 0.707f;
            float bw = 1.0f - p[P_RESONANCE]; bw *= bw;
            float ramped_amp = aenv * amp;
            if (rampcount < RAMPSAMPLES)
                ramped_amp *= (++rampcount) * RAMPSCALE;
            l += channels[0].Process(cut, bw) * ramped_amp;
            r += channels[1].Process(cut, bw) * ramped_amp;
            aenv = aenv * aenvdecay + 1.0e-11f;
            fenv = fenv * fenvdecay + 1.0e-11f;
        }